

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# which.cpp
# Opt level: O3

string * fs_which_abi_cxx11_(string *__return_storage_ptr__,string_view name,string_view path,
                            bool find_all)

{
  undefined1 auVar1 [16];
  string_view path_00;
  string_view path_01;
  string_view path_02;
  string_view path_03;
  _Alloc_hider _Var2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_t sVar9;
  long *plVar10;
  size_type *psVar11;
  short *psVar12;
  string *psVar13;
  undefined3 in_register_00000089;
  undefined4 uVar14;
  long lVar15;
  string_view name_00;
  string_view path_04;
  string_view path_05;
  string_view fname;
  string_view fname_00;
  __string_type __str_1;
  string paths;
  string r;
  string n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string dir;
  undefined1 in_stack_fffffffffffffed8 [12];
  size_t in_stack_fffffffffffffee8;
  long *plVar16;
  char *in_stack_fffffffffffffef0;
  ulong uVar17;
  long local_108;
  long lStack_100;
  string *local_f8;
  string local_f0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  char *local_b0;
  size_t local_a8;
  char local_a0;
  undefined7 uStack_9f;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  uVar14 = CONCAT31(in_register_00000089,find_all);
  sVar9 = path._M_len;
  psVar12 = (short *)name._M_str;
  if ((sVar9 == 0) ||
     (path_03._M_str = in_stack_fffffffffffffef0, path_03._M_len = in_stack_fffffffffffffee8,
     bVar3 = fs_is_dir(path_03), bVar3)) {
    local_f8 = __return_storage_ptr__;
    fs_parent_abi_cxx11_(&local_f0,name);
    iVar5 = std::__cxx11::string::compare((char *)&local_f0);
    if (iVar5 == 0) {
      if (name._M_len < 2) {
        bVar3 = false;
      }
      else {
        bVar3 = *psVar12 == 0x2f2e;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      psVar13 = local_f8;
      if (!bVar3) {
        if (sVar9 == 0) {
          name_00._M_str = "PATH";
          name_00._M_len = 4;
          fs_getenv_abi_cxx11_(&local_f0,name_00);
        }
        else {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,path._M_str,path._M_str + sVar9);
        }
        _Var2._M_p = local_f0._M_dataplus._M_p;
        if (local_f0._M_string_length == 0) {
          local_90._M_string_length = std::_V2::generic_category();
          local_90._M_dataplus._M_p._0_4_ = 0x14;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = _Var2._M_p;
          fname_00._M_str = "fs_which_generic";
          fname_00._M_len = 0x10;
          fs_print_error((string_view)(auVar1 << 0x40),fname_00,(error_code *)&local_90);
          (psVar13->_M_dataplus)._M_p = (pointer)&psVar13->field_2;
          psVar13->_M_string_length = 0;
          (psVar13->field_2)._M_local_buf[0] = '\0';
        }
        else {
          path_04._M_str = local_f0._M_dataplus._M_p;
          path_04._M_len = local_f0._M_string_length;
          fs_as_posix_abi_cxx11_(&local_90,path_04);
          std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,psVar12,name._M_len + (long)psVar12);
          local_b0 = &local_a0;
          lVar15 = 0;
          local_a8 = 0;
          local_a0 = '\0';
          local_d0._M_p = (pointer)&local_c0;
          local_c8 = 0;
          local_c0._M_local_buf[0] = '\0';
          do {
            while( true ) {
              cVar4 = fs_pathsep();
              lVar6 = std::__cxx11::string::find((char)&local_f0,(ulong)(uint)(int)cVar4);
              if (lVar6 != lVar15 || lVar6 == -1) break;
              lVar15 = lVar15 + 1;
            }
            std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_f0);
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_70,local_50,local_48 + (long)local_50);
            std::__cxx11::string::append((char *)local_70);
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_70,(ulong)local_90._M_dataplus._M_p);
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              local_108 = *plVar10;
              lStack_100 = plVar7[3];
              plVar16 = &local_108;
            }
            else {
              local_108 = *plVar10;
              plVar16 = (long *)*plVar7;
            }
            uVar17 = plVar7[1];
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_b0,(string *)&stack0xfffffffffffffee8);
            if (plVar16 != &local_108) {
              operator_delete(plVar16,local_108 + 1);
            }
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            path_01._M_str._4_4_ = uVar14;
            path_01._0_12_ = in_stack_fffffffffffffed8;
            bVar3 = fs_is_file(path_01);
            if ((bVar3) &&
               (path_02._M_str._4_4_ = uVar14, path_02._0_12_ = in_stack_fffffffffffffed8,
               bVar3 = fs_is_exe(path_02), bVar3)) {
              if ((char)uVar14 != '\0') {
                fs_pathsep();
                plVar7 = &local_108;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&stack0xfffffffffffffee8,local_b0,local_b0 + local_a8);
                std::__cxx11::string::_M_replace_aux
                          ((ulong)&stack0xfffffffffffffee8,uVar17,0,'\x01');
                std::__cxx11::string::_M_append((char *)&local_d0,(ulong)plVar7);
                if (plVar7 != &local_108) {
                  operator_delete(plVar7,local_108 + 1);
                }
                goto LAB_0010c2bb;
              }
              cVar4 = '\x01';
              path_05._M_str = local_b0;
              path_05._M_len = local_a8;
              fs_as_posix_abi_cxx11_(local_f8,path_05);
            }
            else {
LAB_0010c2bb:
              lVar6 = lVar6 + 1;
              if (lVar6 != 0) {
                lVar15 = lVar6;
              }
              cVar4 = (lVar6 == 0) * '\x03';
            }
            if (local_50 != local_40) {
              operator_delete(local_50,local_40[0] + 1);
            }
            psVar13 = local_f8;
          } while (cVar4 == '\0');
          if (cVar4 == '\x03') {
            if (((char)uVar14 == '\0') || (local_c8 == 0)) {
              paVar8 = &local_f8->field_2;
              (local_f8->_M_dataplus)._M_p = (pointer)paVar8;
              psVar11 = &local_f8->_M_string_length;
            }
            else {
              std::__cxx11::string::pop_back();
              (psVar13->_M_dataplus)._M_p = (pointer)&psVar13->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_p == &local_c0) {
                (psVar13->field_2)._M_allocated_capacity =
                     CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]);
                *(undefined8 *)((long)&psVar13->field_2 + 8) = local_c0._8_8_;
              }
              else {
                (psVar13->_M_dataplus)._M_p = local_d0._M_p;
                (psVar13->field_2)._M_allocated_capacity =
                     CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]);
              }
              psVar11 = &local_c8;
              psVar13->_M_string_length = local_c8;
              paVar8 = &local_c0;
              local_d0._M_p = (pointer)&local_c0;
            }
            *psVar11 = 0;
            paVar8->_M_local_buf[0] = '\0';
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_p != &local_c0) {
            operator_delete(local_d0._M_p,
                            CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0])
                            + 1);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
          return psVar13;
        }
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        return psVar13;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__ = local_f8;
    path_00._M_str._4_4_ = uVar14;
    path_00._0_12_ = in_stack_fffffffffffffed8;
    bVar3 = fs_is_exe(path_00);
    if (bVar3) {
      fs_as_posix_abi_cxx11_(__return_storage_ptr__,name);
      return __return_storage_ptr__;
    }
  }
  else {
    local_f0._M_string_length = std::_V2::generic_category();
    local_f0._M_dataplus._M_p._0_4_ = 0x14;
    fname._M_str = "fs_which";
    fname._M_len = 8;
    fs_print_error(path,fname,(error_code *)&local_f0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string fs_which(std::string_view name, std::string_view path, const bool find_all)
{
  // find an executable file "name" under each path in
  // environment variable PATH or "path" if specified

  if (!path.empty() && !fs_is_dir(path)){
    fs_print_error(path, __func__, std::make_error_code(std::errc::not_a_directory));
    return {};
  }

#if defined(_WIN32)
  // use SearchPathA, even though the generic method works.
  // This is because SearchPathA uses registry preferences that the generic method ignores.

  if(find_all)
    return fs_which_generic(name, path, true);

  std::string r(fs_get_max_path(), '\0');
  DWORD L;

  // https://learn.microsoft.com/en-us/windows/win32/api/processenv/nf-processenv-searchpatha
  if (path.empty())
    L = SearchPathA(nullptr, name.data(), ".exe", static_cast<DWORD>(r.length()), r.data(), nullptr);
  else
    L = SearchPathA(path.data(), name.data(), ".exe", static_cast<DWORD>(r.length()), r.data(), nullptr);

  if(L == 0 && GetLastError() == ERROR_FILE_NOT_FOUND)
    return {};

  if(L == 0 || L >= r.length()){
    fs_print_error(name, __func__);
    return {};
  }
  r.resize(L);

  if(fs_trace) std::cout << "TRACE: which: SearchPathA: " << r << "  length " << L << "\n";
  if(!fs_is_exe(r))
    return {};

  return fs_as_posix(r);

#else
  return fs_which_generic(name, path, find_all);
#endif
}